

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

token_type __thiscall
nlohmann::detail::
lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::scan_string(lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *this)

{
  initializer_list<int> ranges;
  initializer_list<int> ranges_00;
  initializer_list<int> ranges_01;
  initializer_list<int> ranges_02;
  initializer_list<int> ranges_03;
  initializer_list<int> ranges_04;
  initializer_list<int> ranges_05;
  bool bVar1;
  int_type iVar2;
  bool local_134;
  bool local_133;
  int local_118 [6];
  iterator local_100;
  undefined8 local_f8;
  int local_f0 [6];
  iterator local_d8;
  undefined8 local_d0;
  int local_c8 [6];
  iterator local_b0;
  undefined8 local_a8;
  int local_a0 [4];
  iterator local_90;
  undefined8 local_88;
  int local_80 [4];
  iterator local_70;
  undefined8 local_68;
  int local_60 [4];
  iterator local_50;
  undefined8 local_48;
  int local_40 [2];
  iterator local_38;
  undefined8 local_30;
  int local_24;
  uint local_20;
  int codepoint2;
  int codepoint;
  int codepoint1;
  lexer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *this_local;
  
  _codepoint = this;
  reset(this);
  if (this->current != 0x22) {
    __assert_fail("current == \'\\\"\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                  ,0x92b,
                  "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_string() [BasicJsonType = nlohmann::basic_json<>]"
                 );
  }
  do {
    iVar2 = get(this);
    switch(iVar2) {
    case 0:
      this->error_message =
           "invalid string: control character U+0000 (NUL) must be escaped to \\u0000";
      return parse_error;
    case 1:
      this->error_message =
           "invalid string: control character U+0001 (SOH) must be escaped to \\u0001";
      return parse_error;
    case 2:
      this->error_message =
           "invalid string: control character U+0002 (STX) must be escaped to \\u0002";
      return parse_error;
    case 3:
      this->error_message =
           "invalid string: control character U+0003 (ETX) must be escaped to \\u0003";
      return parse_error;
    case 4:
      this->error_message =
           "invalid string: control character U+0004 (EOT) must be escaped to \\u0004";
      return parse_error;
    case 5:
      this->error_message =
           "invalid string: control character U+0005 (ENQ) must be escaped to \\u0005";
      return parse_error;
    case 6:
      this->error_message =
           "invalid string: control character U+0006 (ACK) must be escaped to \\u0006";
      return parse_error;
    case 7:
      this->error_message =
           "invalid string: control character U+0007 (BEL) must be escaped to \\u0007";
      return parse_error;
    case 8:
      this->error_message =
           "invalid string: control character U+0008 (BS) must be escaped to \\u0008 or \\b";
      return parse_error;
    case 9:
      this->error_message =
           "invalid string: control character U+0009 (HT) must be escaped to \\u0009 or \\t";
      return parse_error;
    case 10:
      this->error_message =
           "invalid string: control character U+000A (LF) must be escaped to \\u000A or \\n";
      return parse_error;
    case 0xb:
      this->error_message =
           "invalid string: control character U+000B (VT) must be escaped to \\u000B";
      return parse_error;
    case 0xc:
      this->error_message =
           "invalid string: control character U+000C (FF) must be escaped to \\u000C or \\f";
      return parse_error;
    case 0xd:
      this->error_message =
           "invalid string: control character U+000D (CR) must be escaped to \\u000D or \\r";
      return parse_error;
    case 0xe:
      this->error_message =
           "invalid string: control character U+000E (SO) must be escaped to \\u000E";
      return parse_error;
    case 0xf:
      this->error_message =
           "invalid string: control character U+000F (SI) must be escaped to \\u000F";
      return parse_error;
    case 0x10:
      this->error_message =
           "invalid string: control character U+0010 (DLE) must be escaped to \\u0010";
      return parse_error;
    case 0x11:
      this->error_message =
           "invalid string: control character U+0011 (DC1) must be escaped to \\u0011";
      return parse_error;
    case 0x12:
      this->error_message =
           "invalid string: control character U+0012 (DC2) must be escaped to \\u0012";
      return parse_error;
    case 0x13:
      this->error_message =
           "invalid string: control character U+0013 (DC3) must be escaped to \\u0013";
      return parse_error;
    case 0x14:
      this->error_message =
           "invalid string: control character U+0014 (DC4) must be escaped to \\u0014";
      return parse_error;
    case 0x15:
      this->error_message =
           "invalid string: control character U+0015 (NAK) must be escaped to \\u0015";
      return parse_error;
    case 0x16:
      this->error_message =
           "invalid string: control character U+0016 (SYN) must be escaped to \\u0016";
      return parse_error;
    case 0x17:
      this->error_message =
           "invalid string: control character U+0017 (ETB) must be escaped to \\u0017";
      return parse_error;
    case 0x18:
      this->error_message =
           "invalid string: control character U+0018 (CAN) must be escaped to \\u0018";
      return parse_error;
    case 0x19:
      this->error_message =
           "invalid string: control character U+0019 (EM) must be escaped to \\u0019";
      return parse_error;
    case 0x1a:
      this->error_message =
           "invalid string: control character U+001A (SUB) must be escaped to \\u001A";
      return parse_error;
    case 0x1b:
      this->error_message =
           "invalid string: control character U+001B (ESC) must be escaped to \\u001B";
      return parse_error;
    case 0x1c:
      this->error_message =
           "invalid string: control character U+001C (FS) must be escaped to \\u001C";
      return parse_error;
    case 0x1d:
      this->error_message =
           "invalid string: control character U+001D (GS) must be escaped to \\u001D";
      return parse_error;
    case 0x1e:
      this->error_message =
           "invalid string: control character U+001E (RS) must be escaped to \\u001E";
      return parse_error;
    case 0x1f:
      this->error_message =
           "invalid string: control character U+001F (US) must be escaped to \\u001F";
      return parse_error;
    case 0x20:
    case 0x21:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
    case 0x30:
    case 0x31:
    case 0x32:
    case 0x33:
    case 0x34:
    case 0x35:
    case 0x36:
    case 0x37:
    case 0x38:
    case 0x39:
    case 0x3a:
    case 0x3b:
    case 0x3c:
    case 0x3d:
    case 0x3e:
    case 0x3f:
    case 0x40:
    case 0x41:
    case 0x42:
    case 0x43:
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
    case 0x48:
    case 0x49:
    case 0x4a:
    case 0x4b:
    case 0x4c:
    case 0x4d:
    case 0x4e:
    case 0x4f:
    case 0x50:
    case 0x51:
    case 0x52:
    case 0x53:
    case 0x54:
    case 0x55:
    case 0x56:
    case 0x57:
    case 0x58:
    case 0x59:
    case 0x5a:
    case 0x5b:
    case 0x5d:
    case 0x5e:
    case 0x5f:
    case 0x60:
    case 0x61:
    case 0x62:
    case 99:
    case 100:
    case 0x65:
    case 0x66:
    case 0x67:
    case 0x68:
    case 0x69:
    case 0x6a:
    case 0x6b:
    case 0x6c:
    case 0x6d:
    case 0x6e:
    case 0x6f:
    case 0x70:
    case 0x71:
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
    case 0x76:
    case 0x77:
    case 0x78:
    case 0x79:
    case 0x7a:
    case 0x7b:
    case 0x7c:
    case 0x7d:
    case 0x7e:
    case 0x7f:
      add(this,this->current);
      break;
    case 0x22:
      return value_string;
    case 0x5c:
      iVar2 = get(this);
      switch(iVar2) {
      case 0x22:
        add(this,0x22);
        break;
      default:
        this->error_message = "invalid string: forbidden character after backslash";
        return parse_error;
      case 0x2f:
        add(this,0x2f);
        break;
      case 0x5c:
        add(this,0x5c);
        break;
      case 0x62:
        add(this,8);
        break;
      case 0x66:
        add(this,0xc);
        break;
      case 0x6e:
        add(this,10);
        break;
      case 0x72:
        add(this,0xd);
        break;
      case 0x74:
        add(this,9);
        break;
      case 0x75:
        local_20 = get_codepoint(this);
        if (local_20 == 0xffffffff) {
          this->error_message = "invalid string: \'\\u\' must be followed by 4 hex digits";
          return parse_error;
        }
        codepoint2 = local_20;
        if (((int)local_20 < 0xd800) || (0xdbff < (int)local_20)) {
          local_133 = 0xdbff < (int)local_20 && (int)local_20 < 0xe000;
          if (local_133) {
            this->error_message =
                 "invalid string: surrogate U+DC00..U+DFFF must follow U+D800..U+DBFF";
            return parse_error;
          }
        }
        else {
          iVar2 = get(this);
          bVar1 = false;
          if (iVar2 == 0x5c) {
            iVar2 = get(this);
            bVar1 = iVar2 == 0x75;
          }
          if (!bVar1) {
            this->error_message =
                 "invalid string: surrogate U+DC00..U+DFFF must be followed by U+DC00..U+DFFF";
            return parse_error;
          }
          local_24 = get_codepoint(this);
          if (local_24 == -1) {
            this->error_message = "invalid string: \'\\u\' must be followed by 4 hex digits";
            return parse_error;
          }
          if (local_24 < 0xdc00 || 0xdfff < local_24) {
            this->error_message =
                 "invalid string: surrogate U+DC00..U+DFFF must be followed by U+DC00..U+DFFF";
            return parse_error;
          }
          local_20 = codepoint2 * 0x400 + local_24 + 0xfca02400;
        }
        local_134 = 0x10ffff < local_20;
        if (local_134) {
          __assert_fail("0x00 <= codepoint and codepoint <= 0x10FFFF",
                        "/workspace/llm4binary/github/license_c_cmakelists/open-license-manager[P]licensecc/extern/license-generator/src/license_generator/../inja/nlohmann/json.hpp"
                        ,0x994,
                        "token_type nlohmann::detail::lexer<nlohmann::basic_json<>>::scan_string() [BasicJsonType = nlohmann::basic_json<>]"
                       );
        }
        if ((int)local_20 < 0x80) {
          add(this,local_20);
        }
        else if ((int)local_20 < 0x800) {
          add(this,(int)local_20 >> 6 | 0xc0);
          add(this,local_20 & 0x3f | 0x80);
        }
        else if ((int)local_20 < 0x10000) {
          add(this,(int)local_20 >> 0xc | 0xe0);
          add(this,(int)local_20 >> 6 & 0x3fU | 0x80);
          add(this,local_20 & 0x3f | 0x80);
        }
        else {
          add(this,(int)local_20 >> 0x12 | 0xf0);
          add(this,(int)local_20 >> 0xc & 0x3fU | 0x80);
          add(this,(int)local_20 >> 6 & 0x3fU | 0x80);
          add(this,local_20 & 0x3f | 0x80);
        }
      }
      break;
    default:
      this->error_message = "invalid string: ill-formed UTF-8 byte";
      return parse_error;
    case 0xc2:
    case 0xc3:
    case 0xc4:
    case 0xc5:
    case 0xc6:
    case 199:
    case 200:
    case 0xc9:
    case 0xca:
    case 0xcb:
    case 0xcc:
    case 0xcd:
    case 0xce:
    case 0xcf:
    case 0xd0:
    case 0xd1:
    case 0xd2:
    case 0xd3:
    case 0xd4:
    case 0xd5:
    case 0xd6:
    case 0xd7:
    case 0xd8:
    case 0xd9:
    case 0xda:
    case 0xdb:
    case 0xdc:
    case 0xdd:
    case 0xde:
    case 0xdf:
      local_40[0] = 0x80;
      local_40[1] = 0xbf;
      local_38 = local_40;
      local_30 = 2;
      ranges_05._M_len = 2;
      ranges_05._M_array = local_38;
      bVar1 = next_byte_in_range(this,ranges_05);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return parse_error;
      }
      break;
    case 0xe0:
      local_60[0] = 0xa0;
      local_60[1] = 0xbf;
      local_60[2] = 0x80;
      local_60[3] = 0xbf;
      local_50 = local_60;
      local_48 = 4;
      ranges_04._M_len = 4;
      ranges_04._M_array = local_50;
      bVar1 = next_byte_in_range(this,ranges_04);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return parse_error;
      }
      break;
    case 0xe1:
    case 0xe2:
    case 0xe3:
    case 0xe4:
    case 0xe5:
    case 0xe6:
    case 0xe7:
    case 0xe8:
    case 0xe9:
    case 0xea:
    case 0xeb:
    case 0xec:
    case 0xee:
    case 0xef:
      local_80[0] = 0x80;
      local_80[1] = 0xbf;
      local_80[2] = 0x80;
      local_80[3] = 0xbf;
      local_70 = local_80;
      local_68 = 4;
      ranges_03._M_len = 4;
      ranges_03._M_array = local_70;
      bVar1 = next_byte_in_range(this,ranges_03);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return parse_error;
      }
      break;
    case 0xed:
      local_a0[0] = 0x80;
      local_a0[1] = 0x9f;
      local_a0[2] = 0x80;
      local_a0[3] = 0xbf;
      local_90 = local_a0;
      local_88 = 4;
      ranges_02._M_len = 4;
      ranges_02._M_array = local_90;
      bVar1 = next_byte_in_range(this,ranges_02);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return parse_error;
      }
      break;
    case 0xf0:
      local_c8[0] = 0x90;
      local_c8[1] = 0xbf;
      local_c8[2] = 0x80;
      local_c8[3] = 0xbf;
      local_c8[4] = 0x80;
      local_c8[5] = 0xbf;
      local_b0 = local_c8;
      local_a8 = 6;
      ranges_01._M_len = 6;
      ranges_01._M_array = local_b0;
      bVar1 = next_byte_in_range(this,ranges_01);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return parse_error;
      }
      break;
    case 0xf1:
    case 0xf2:
    case 0xf3:
      local_f0[0] = 0x80;
      local_f0[1] = 0xbf;
      local_f0[2] = 0x80;
      local_f0[3] = 0xbf;
      local_f0[4] = 0x80;
      local_f0[5] = 0xbf;
      local_d8 = local_f0;
      local_d0 = 6;
      ranges_00._M_len = 6;
      ranges_00._M_array = local_d8;
      bVar1 = next_byte_in_range(this,ranges_00);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return parse_error;
      }
      break;
    case 0xf4:
      local_118[0] = 0x80;
      local_118[1] = 0x8f;
      local_118[2] = 0x80;
      local_118[3] = 0xbf;
      local_118[4] = 0x80;
      local_118[5] = 0xbf;
      local_100 = local_118;
      local_f8 = 6;
      ranges._M_len = 6;
      ranges._M_array = local_100;
      bVar1 = next_byte_in_range(this,ranges);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        return parse_error;
      }
      break;
    case -1:
      this->error_message = "invalid string: missing closing quote";
      return parse_error;
    }
  } while( true );
}

Assistant:

token_type scan_string() {
		// reset token_buffer (ignore opening quote)
		reset();

		// we entered the function by reading an open quote
		assert(current == '\"');

		while (true) {
			// get next character
			switch (get()) {
				// end of file while parsing string
				case std::char_traits<char>::eof(): {
					error_message = "invalid string: missing closing quote";
					return token_type::parse_error;
				}

				// closing quote
				case '\"': {
					return token_type::value_string;
				}

				// escapes
				case '\\': {
					switch (get()) {
						// quotation mark
						case '\"':
							add('\"');
							break;
						// reverse solidus
						case '\\':
							add('\\');
							break;
						// solidus
						case '/':
							add('/');
							break;
						// backspace
						case 'b':
							add('\b');
							break;
						// form feed
						case 'f':
							add('\f');
							break;
						// line feed
						case 'n':
							add('\n');
							break;
						// carriage return
						case 'r':
							add('\r');
							break;
						// tab
						case 't':
							add('\t');
							break;

						// unicode escapes
						case 'u': {
							const int codepoint1 = get_codepoint();
							int codepoint = codepoint1;  // start with codepoint1

							if (JSON_UNLIKELY(codepoint1 == -1)) {
								error_message = "invalid string: '\\u' must be followed by 4 hex digits";
								return token_type::parse_error;
							}

							// check if code point is a high surrogate
							if (0xD800 <= codepoint1 and codepoint1 <= 0xDBFF) {
								// expect next \uxxxx entry
								if (JSON_LIKELY(get() == '\\' and get() == 'u')) {
									const int codepoint2 = get_codepoint();

									if (JSON_UNLIKELY(codepoint2 == -1)) {
										error_message = "invalid string: '\\u' must be followed by 4 hex digits";
										return token_type::parse_error;
									}

									// check if codepoint2 is a low surrogate
									if (JSON_LIKELY(0xDC00 <= codepoint2 and codepoint2 <= 0xDFFF)) {
										// overwrite codepoint
										codepoint =
											// high surrogate occupies the most significant 22 bits
											(codepoint1 << 10)
											// low surrogate occupies the least significant 15 bits
											+ codepoint2
											// there is still the 0xD800, 0xDC00 and 0x10000 noise
											// in the result so we have to subtract with:
											// (0xD800 << 10) + DC00 - 0x10000 = 0x35FDC00
											- 0x35FDC00;
									} else {
										error_message =
											"invalid string: surrogate U+DC00..U+DFFF must be followed by "
											"U+DC00..U+DFFF";
										return token_type::parse_error;
									}
								} else {
									error_message =
										"invalid string: surrogate U+DC00..U+DFFF must be followed by U+DC00..U+DFFF";
									return token_type::parse_error;
								}
							} else {
								if (JSON_UNLIKELY(0xDC00 <= codepoint1 and codepoint1 <= 0xDFFF)) {
									error_message =
										"invalid string: surrogate U+DC00..U+DFFF must follow U+D800..U+DBFF";
									return token_type::parse_error;
								}
							}

							// result of the above calculation yields a proper codepoint
							assert(0x00 <= codepoint and codepoint <= 0x10FFFF);

							// translate codepoint into bytes
							if (codepoint < 0x80) {
								// 1-byte characters: 0xxxxxxx (ASCII)
								add(codepoint);
							} else if (codepoint <= 0x7FF) {
								// 2-byte characters: 110xxxxx 10xxxxxx
								add(0xC0 | (codepoint >> 6));
								add(0x80 | (codepoint & 0x3F));
							} else if (codepoint <= 0xFFFF) {
								// 3-byte characters: 1110xxxx 10xxxxxx 10xxxxxx
								add(0xE0 | (codepoint >> 12));
								add(0x80 | ((codepoint >> 6) & 0x3F));
								add(0x80 | (codepoint & 0x3F));
							} else {
								// 4-byte characters: 11110xxx 10xxxxxx 10xxxxxx 10xxxxxx
								add(0xF0 | (codepoint >> 18));
								add(0x80 | ((codepoint >> 12) & 0x3F));
								add(0x80 | ((codepoint >> 6) & 0x3F));
								add(0x80 | (codepoint & 0x3F));
							}

							break;
						}

						// other characters after escape
						default:
							error_message = "invalid string: forbidden character after backslash";
							return token_type::parse_error;
					}

					break;
				}

				// invalid control characters
				case 0x00: {
					error_message = "invalid string: control character U+0000 (NUL) must be escaped to \\u0000";
					return token_type::parse_error;
				}

				case 0x01: {
					error_message = "invalid string: control character U+0001 (SOH) must be escaped to \\u0001";
					return token_type::parse_error;
				}

				case 0x02: {
					error_message = "invalid string: control character U+0002 (STX) must be escaped to \\u0002";
					return token_type::parse_error;
				}

				case 0x03: {
					error_message = "invalid string: control character U+0003 (ETX) must be escaped to \\u0003";
					return token_type::parse_error;
				}

				case 0x04: {
					error_message = "invalid string: control character U+0004 (EOT) must be escaped to \\u0004";
					return token_type::parse_error;
				}

				case 0x05: {
					error_message = "invalid string: control character U+0005 (ENQ) must be escaped to \\u0005";
					return token_type::parse_error;
				}

				case 0x06: {
					error_message = "invalid string: control character U+0006 (ACK) must be escaped to \\u0006";
					return token_type::parse_error;
				}

				case 0x07: {
					error_message = "invalid string: control character U+0007 (BEL) must be escaped to \\u0007";
					return token_type::parse_error;
				}

				case 0x08: {
					error_message = "invalid string: control character U+0008 (BS) must be escaped to \\u0008 or \\b";
					return token_type::parse_error;
				}

				case 0x09: {
					error_message = "invalid string: control character U+0009 (HT) must be escaped to \\u0009 or \\t";
					return token_type::parse_error;
				}

				case 0x0A: {
					error_message = "invalid string: control character U+000A (LF) must be escaped to \\u000A or \\n";
					return token_type::parse_error;
				}

				case 0x0B: {
					error_message = "invalid string: control character U+000B (VT) must be escaped to \\u000B";
					return token_type::parse_error;
				}

				case 0x0C: {
					error_message = "invalid string: control character U+000C (FF) must be escaped to \\u000C or \\f";
					return token_type::parse_error;
				}

				case 0x0D: {
					error_message = "invalid string: control character U+000D (CR) must be escaped to \\u000D or \\r";
					return token_type::parse_error;
				}

				case 0x0E: {
					error_message = "invalid string: control character U+000E (SO) must be escaped to \\u000E";
					return token_type::parse_error;
				}

				case 0x0F: {
					error_message = "invalid string: control character U+000F (SI) must be escaped to \\u000F";
					return token_type::parse_error;
				}

				case 0x10: {
					error_message = "invalid string: control character U+0010 (DLE) must be escaped to \\u0010";
					return token_type::parse_error;
				}

				case 0x11: {
					error_message = "invalid string: control character U+0011 (DC1) must be escaped to \\u0011";
					return token_type::parse_error;
				}

				case 0x12: {
					error_message = "invalid string: control character U+0012 (DC2) must be escaped to \\u0012";
					return token_type::parse_error;
				}

				case 0x13: {
					error_message = "invalid string: control character U+0013 (DC3) must be escaped to \\u0013";
					return token_type::parse_error;
				}

				case 0x14: {
					error_message = "invalid string: control character U+0014 (DC4) must be escaped to \\u0014";
					return token_type::parse_error;
				}

				case 0x15: {
					error_message = "invalid string: control character U+0015 (NAK) must be escaped to \\u0015";
					return token_type::parse_error;
				}

				case 0x16: {
					error_message = "invalid string: control character U+0016 (SYN) must be escaped to \\u0016";
					return token_type::parse_error;
				}

				case 0x17: {
					error_message = "invalid string: control character U+0017 (ETB) must be escaped to \\u0017";
					return token_type::parse_error;
				}

				case 0x18: {
					error_message = "invalid string: control character U+0018 (CAN) must be escaped to \\u0018";
					return token_type::parse_error;
				}

				case 0x19: {
					error_message = "invalid string: control character U+0019 (EM) must be escaped to \\u0019";
					return token_type::parse_error;
				}

				case 0x1A: {
					error_message = "invalid string: control character U+001A (SUB) must be escaped to \\u001A";
					return token_type::parse_error;
				}

				case 0x1B: {
					error_message = "invalid string: control character U+001B (ESC) must be escaped to \\u001B";
					return token_type::parse_error;
				}

				case 0x1C: {
					error_message = "invalid string: control character U+001C (FS) must be escaped to \\u001C";
					return token_type::parse_error;
				}

				case 0x1D: {
					error_message = "invalid string: control character U+001D (GS) must be escaped to \\u001D";
					return token_type::parse_error;
				}

				case 0x1E: {
					error_message = "invalid string: control character U+001E (RS) must be escaped to \\u001E";
					return token_type::parse_error;
				}

				case 0x1F: {
					error_message = "invalid string: control character U+001F (US) must be escaped to \\u001F";
					return token_type::parse_error;
				}

				// U+0020..U+007F (except U+0022 (quote) and U+005C (backspace))
				case 0x20:
				case 0x21:
				case 0x23:
				case 0x24:
				case 0x25:
				case 0x26:
				case 0x27:
				case 0x28:
				case 0x29:
				case 0x2A:
				case 0x2B:
				case 0x2C:
				case 0x2D:
				case 0x2E:
				case 0x2F:
				case 0x30:
				case 0x31:
				case 0x32:
				case 0x33:
				case 0x34:
				case 0x35:
				case 0x36:
				case 0x37:
				case 0x38:
				case 0x39:
				case 0x3A:
				case 0x3B:
				case 0x3C:
				case 0x3D:
				case 0x3E:
				case 0x3F:
				case 0x40:
				case 0x41:
				case 0x42:
				case 0x43:
				case 0x44:
				case 0x45:
				case 0x46:
				case 0x47:
				case 0x48:
				case 0x49:
				case 0x4A:
				case 0x4B:
				case 0x4C:
				case 0x4D:
				case 0x4E:
				case 0x4F:
				case 0x50:
				case 0x51:
				case 0x52:
				case 0x53:
				case 0x54:
				case 0x55:
				case 0x56:
				case 0x57:
				case 0x58:
				case 0x59:
				case 0x5A:
				case 0x5B:
				case 0x5D:
				case 0x5E:
				case 0x5F:
				case 0x60:
				case 0x61:
				case 0x62:
				case 0x63:
				case 0x64:
				case 0x65:
				case 0x66:
				case 0x67:
				case 0x68:
				case 0x69:
				case 0x6A:
				case 0x6B:
				case 0x6C:
				case 0x6D:
				case 0x6E:
				case 0x6F:
				case 0x70:
				case 0x71:
				case 0x72:
				case 0x73:
				case 0x74:
				case 0x75:
				case 0x76:
				case 0x77:
				case 0x78:
				case 0x79:
				case 0x7A:
				case 0x7B:
				case 0x7C:
				case 0x7D:
				case 0x7E:
				case 0x7F: {
					add(current);
					break;
				}

				// U+0080..U+07FF: bytes C2..DF 80..BF
				case 0xC2:
				case 0xC3:
				case 0xC4:
				case 0xC5:
				case 0xC6:
				case 0xC7:
				case 0xC8:
				case 0xC9:
				case 0xCA:
				case 0xCB:
				case 0xCC:
				case 0xCD:
				case 0xCE:
				case 0xCF:
				case 0xD0:
				case 0xD1:
				case 0xD2:
				case 0xD3:
				case 0xD4:
				case 0xD5:
				case 0xD6:
				case 0xD7:
				case 0xD8:
				case 0xD9:
				case 0xDA:
				case 0xDB:
				case 0xDC:
				case 0xDD:
				case 0xDE:
				case 0xDF: {
					if (JSON_UNLIKELY(not next_byte_in_range({0x80, 0xBF}))) {
						return token_type::parse_error;
					}
					break;
				}

				// U+0800..U+0FFF: bytes E0 A0..BF 80..BF
				case 0xE0: {
					if (JSON_UNLIKELY(not(next_byte_in_range({0xA0, 0xBF, 0x80, 0xBF})))) {
						return token_type::parse_error;
					}
					break;
				}

				// U+1000..U+CFFF: bytes E1..EC 80..BF 80..BF
				// U+E000..U+FFFF: bytes EE..EF 80..BF 80..BF
				case 0xE1:
				case 0xE2:
				case 0xE3:
				case 0xE4:
				case 0xE5:
				case 0xE6:
				case 0xE7:
				case 0xE8:
				case 0xE9:
				case 0xEA:
				case 0xEB:
				case 0xEC:
				case 0xEE:
				case 0xEF: {
					if (JSON_UNLIKELY(not(next_byte_in_range({0x80, 0xBF, 0x80, 0xBF})))) {
						return token_type::parse_error;
					}
					break;
				}

				// U+D000..U+D7FF: bytes ED 80..9F 80..BF
				case 0xED: {
					if (JSON_UNLIKELY(not(next_byte_in_range({0x80, 0x9F, 0x80, 0xBF})))) {
						return token_type::parse_error;
					}
					break;
				}

				// U+10000..U+3FFFF F0 90..BF 80..BF 80..BF
				case 0xF0: {
					if (JSON_UNLIKELY(not(next_byte_in_range({0x90, 0xBF, 0x80, 0xBF, 0x80, 0xBF})))) {
						return token_type::parse_error;
					}
					break;
				}

				// U+40000..U+FFFFF F1..F3 80..BF 80..BF 80..BF
				case 0xF1:
				case 0xF2:
				case 0xF3: {
					if (JSON_UNLIKELY(not(next_byte_in_range({0x80, 0xBF, 0x80, 0xBF, 0x80, 0xBF})))) {
						return token_type::parse_error;
					}
					break;
				}

				// U+100000..U+10FFFF F4 80..8F 80..BF 80..BF
				case 0xF4: {
					if (JSON_UNLIKELY(not(next_byte_in_range({0x80, 0x8F, 0x80, 0xBF, 0x80, 0xBF})))) {
						return token_type::parse_error;
					}
					break;
				}

				// remaining bytes (80..C1 and F5..FF) are ill-formed
				default: {
					error_message = "invalid string: ill-formed UTF-8 byte";
					return token_type::parse_error;
				}
			}
		}
	}